

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.c
# Opt level: O0

int mj_effect_pixelate(mj_jpeg_t *m)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long in_RDI;
  JCOEFPTR coefs;
  JBLOCKARRAY blocks;
  jpeg_component_info *component;
  JDIMENSION l;
  JDIMENSION k;
  int c;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x290) == 0)) {
    local_4 = 2;
  }
  else {
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x38); local_18 = local_18 + 1) {
      lVar1 = *(long *)(in_RDI + 0x130) + (long)local_18 * 0x60;
      for (local_20 = 0; local_20 < *(uint *)(lVar1 + 0x20); local_20 = local_20 + 1) {
        plVar2 = (long *)(**(code **)(*(long *)(in_RDI + 8) + 0x40))
                                   (in_RDI,*(undefined8 *)
                                            (*(long *)(in_RDI + 0x290) + (long)local_18 * 8),
                                    local_20,1);
        for (local_1c = 0; local_1c < *(uint *)(lVar1 + 0x1c); local_1c = local_1c + 1) {
          lVar3 = *plVar2 + (ulong)local_1c * 0x80;
          *(undefined2 *)(lVar3 + 2) = 0;
          *(undefined2 *)(lVar3 + 4) = 0;
          *(undefined2 *)(lVar3 + 6) = 0;
          *(undefined2 *)(lVar3 + 8) = 0;
          *(undefined2 *)(lVar3 + 10) = 0;
          *(undefined2 *)(lVar3 + 0xc) = 0;
          *(undefined2 *)(lVar3 + 0xe) = 0;
          for (local_14 = 8; local_14 < 0x40; local_14 = local_14 + 8) {
            *(undefined2 *)(lVar3 + (long)local_14 * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 1) * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 2) * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 3) * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 4) * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 5) * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 6) * 2) = 0;
            *(undefined2 *)(lVar3 + (long)(local_14 + 7) * 2) = 0;
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mj_effect_pixelate(mj_jpeg_t *m) {
    int                  i, c;
    JDIMENSION           k, l;
    jpeg_component_info *component;
    JBLOCKARRAY          blocks;
    JCOEFPTR             coefs;

    if(m == NULL || m->coef == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    /* Set all the AC coefficients to 0 */
    for(c = 0; c < m->cinfo.num_components; c++) {
        component = &m->cinfo.comp_info[c];

        for(l = 0; l < component->height_in_blocks; l++) {
            blocks = (*m->cinfo.mem->access_virt_barray)((j_common_ptr)&m->cinfo, m->coef[c], l, 1, TRUE);

            for(k = 0; k < component->width_in_blocks; k++) {
                coefs = blocks[0][k];

                coefs[1] = 0;
                coefs[2] = 0;
                coefs[3] = 0;
                coefs[4] = 0;
                coefs[5] = 0;
                coefs[6] = 0;
                coefs[7] = 0;

                for(i = 8; i < DCTSIZE2; i += 8) {
                    coefs[i + 0] = 0;
                    coefs[i + 1] = 0;
                    coefs[i + 2] = 0;
                    coefs[i + 3] = 0;
                    coefs[i + 4] = 0;
                    coefs[i + 5] = 0;
                    coefs[i + 6] = 0;
                    coefs[i + 7] = 0;
                }
            }
        }
    }

    return MJ_OK;
}